

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O3

Vec_Ptr_t * Amap_LibSelectGates(Amap_Lib_t *p,int fVerbose)

{
  void *pvVar1;
  void *__s2;
  void *pvVar2;
  Amap_Gat_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  int iVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  long lVar10;
  ulong local_48;
  
  iVar7 = 0;
  pAVar3 = Amap_LibFindGate(p,0);
  p->pGate0 = pAVar3;
  pAVar3 = Amap_LibFindGate(p,0xffffffff);
  p->pGate1 = pAVar3;
  pAVar3 = Amap_LibFindGate(p,0xaaaaaaaa);
  p->pGateBuf = pAVar3;
  pAVar3 = Amap_LibFindGate(p,0x55555555);
  p->pGateInv = pAVar3;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pVVar8 = p->vSorted;
  if (0 < pVVar8->nSize) {
    local_48 = 100;
    lVar9 = 0;
    do {
      ppvVar5 = pVVar8->pArray;
      pvVar1 = ppvVar5[lVar9];
      __s2 = *(void **)((long)pvVar1 + 0x30);
      if ((__s2 != (void *)0x0) && (*(long *)((long)pvVar1 + 8) == 0)) {
        if (lVar9 != 0) {
          lVar10 = 0;
          do {
            pvVar2 = ppvVar5[lVar10];
            if ((*(void **)((long)pvVar2 + 0x30) != (void *)0x0) &&
               (*(long *)((long)pvVar2 + 8) == 0)) {
              if (*(uint *)((long)pvVar2 + 0x38) >> 0x18 == *(uint *)((long)pvVar1 + 0x38) >> 0x18)
              {
                iVar6 = 1 << ((char)(*(uint *)((long)pvVar2 + 0x38) >> 0x18) - 5U & 0x1f);
                if (*(uint *)((long)pvVar1 + 0x38) < 0x6000000) {
                  iVar6 = 1;
                }
                iVar6 = bcmp(*(void **)((long)pvVar2 + 0x30),__s2,(long)iVar6 << 2);
                if (iVar6 == 0) goto LAB_00447baa;
              }
            }
            lVar10 = lVar10 + 1;
          } while (lVar9 != lVar10);
        }
        iVar6 = (int)local_48;
        if (iVar7 == iVar6) {
          if (iVar6 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
            }
            pVVar4->pArray = ppvVar5;
            pVVar4->nCap = 0x10;
            local_48 = 0x10;
          }
          else {
            local_48 = (ulong)(uint)(iVar6 * 2);
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(local_48 * 8);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,local_48 * 8);
            }
            pVVar4->pArray = ppvVar5;
            pVVar4->nCap = iVar6 * 2;
          }
        }
        else {
          ppvVar5 = pVVar4->pArray;
        }
        lVar10 = (long)iVar7;
        iVar7 = iVar7 + 1;
        pVVar4->nSize = iVar7;
        ppvVar5[lVar10] = pvVar1;
        pVVar8 = p->vSorted;
      }
LAB_00447baa:
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar8->nSize);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Amap_LibSelectGates( Amap_Lib_t * p, int fVerbose )
{
    Vec_Ptr_t * vSelect;
    Amap_Gat_t * pGate, * pGate2;
    int i, k;//, clk = Abc_Clock();
    p->pGate0   = Amap_LibFindGate( p, 0 );
    p->pGate1   = Amap_LibFindGate( p, ~0 );
    p->pGateBuf = Amap_LibFindGate( p, 0xAAAAAAAA );
    p->pGateInv = Amap_LibFindGate( p, ~0xAAAAAAAA );
    vSelect = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Amap_Gat_t *, p->vSorted, pGate, i )
    {
        if ( pGate->pFunc == NULL || pGate->pTwin != NULL )
            continue;
        Vec_PtrForEachEntryStop( Amap_Gat_t *, p->vSorted, pGate2, k, i )
        {
            if ( pGate2->pFunc == NULL || pGate2->pTwin != NULL )
                continue;
            if ( pGate2->nPins != pGate->nPins )
                continue;
            if ( !memcmp( pGate2->pFunc, pGate->pFunc, sizeof(unsigned) * Abc_TruthWordNum(pGate->nPins) ) )
                break;
        }
        if ( k < i )
            continue;
        Vec_PtrPush( vSelect, pGate );            
    }
    return vSelect;
}